

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O2

void InternalSphere::Statistics
               (dgSphere *sphere,dgVector *eigenValues,dgVector *scaleVector,HaF32 *vertex,
               HaI32 *faceIndex,HaI32 indexCount,HaI32 stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  double dVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  dgSphere *pdVar6;
  dgTemplateVector<float> dVar7;
  dgTemplateVector<float> dVar8;
  undefined8 uVar9;
  dgTemplateVector<float> *A;
  long lVar10;
  HaF32 *pHVar11;
  HaI32 *pHVar12;
  dgMatrix *initialGuess;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float fVar40;
  undefined1 auVar41 [64];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_register_00001584 [12];
  dgTemplateVector<float> dVar49;
  dgVector p0;
  dgVector p2;
  dgVector p1;
  dgVector normal;
  float local_184;
  float local_180;
  float local_17c;
  dgTemplateVector<float> local_178;
  dgTemplateVector<float> local_168;
  dgTemplateVector<float> local_158;
  dgTemplateVector<float> local_148;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  double local_118;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  dgTemplateVector<float> *local_e0;
  dgTemplateVector<float> local_d8;
  dgTemplateVector<float> local_c8;
  undefined1 local_b8 [16];
  dgSphere *local_a8;
  dgVector *local_a0;
  double local_98;
  double local_90;
  long local_88;
  HaF32 *local_80;
  HaI32 *local_78;
  long local_70;
  dgTemplateVector<float> local_68;
  double local_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  undefined1 auVar27 [56];
  undefined1 auVar39 [56];
  
  local_88 = (long)stride;
  local_70 = (long)indexCount;
  auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
  _local_f8 = ZEXT816(0) << 0x40;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_128._0_8_;
  local_128 = auVar33 << 0x40;
  _local_108 = ZEXT816(0);
  local_118 = 0.0;
  auVar13 = ZEXT416(0) << 0x20;
  local_17c = 0.0;
  local_180 = 0.0;
  local_184 = 0.0;
  local_e0 = &scaleVector->super_dgTemplateVector<float>;
  local_a8 = sphere;
  local_a0 = eigenValues;
  local_80 = vertex;
  local_78 = faceIndex;
  while( true ) {
    pHVar12 = local_78;
    pHVar11 = local_80;
    lVar10 = local_88;
    auVar39 = auVar34._8_56_;
    auVar27 = ZEXT856(auVar13._8_8_);
    auVar13 = auVar41._0_16_;
    auVar33 = auVar34._0_16_;
    uVar9 = local_128._0_8_;
    if (local_70 <= (long)local_128._0_8_) break;
    dgVector::dgVector((dgVector *)&local_168,local_80 + local_78[local_128._0_8_] * local_88);
    dVar49 = dgTemplateVector<float>::CompProduct(&local_168,local_e0);
    auVar35._0_8_ = dVar49._8_8_;
    auVar35._8_56_ = auVar39;
    auVar23._0_8_ = dVar49._0_8_;
    auVar23._8_56_ = auVar27;
    local_158 = (dgTemplateVector<float>)vmovlhps_avx(auVar23._0_16_,auVar35._0_16_);
    dgVector::dgVector((dgVector *)&local_148,&local_158);
    auVar27 = ZEXT856((ulong)local_148._8_8_);
    local_168.m_x = local_148.m_x;
    local_168.m_y = local_148.m_y;
    local_168.m_z = local_148.m_z;
    local_168.m_w = local_148.m_w;
    dgVector::dgVector((dgVector *)&local_148,pHVar11 + pHVar12[uVar9 + 1] * lVar10);
    A = local_e0;
    dVar49 = dgTemplateVector<float>::CompProduct(&local_148,local_e0);
    auVar36._0_8_ = dVar49._8_8_;
    auVar36._8_56_ = auVar39;
    auVar24._0_8_ = dVar49._0_8_;
    auVar24._8_56_ = auVar27;
    local_d8 = (dgTemplateVector<float>)vmovlhps_avx(auVar24._0_16_,auVar36._0_16_);
    dgVector::dgVector((dgVector *)&local_158,&local_d8);
    auVar27 = ZEXT856((ulong)local_158._8_8_);
    local_148 = local_158;
    dgVector::dgVector((dgVector *)&local_158,pHVar11 + pHVar12[uVar9 + 2] * lVar10);
    dVar49 = dgTemplateVector<float>::CompProduct(&local_158,A);
    auVar37._0_8_ = dVar49._8_8_;
    auVar37._8_56_ = auVar39;
    auVar25._0_8_ = dVar49._0_8_;
    auVar25._8_56_ = auVar27;
    local_178 = (dgTemplateVector<float>)vmovlhps_avx(auVar25._0_16_,auVar37._0_16_);
    dgVector::dgVector((dgVector *)&local_d8,&local_178);
    dVar49 = local_d8;
    dVar7 = local_148;
    auVar28._4_4_ = local_168.m_y;
    auVar28._0_4_ = local_168.m_x;
    auVar28._8_8_ = 0;
    local_158 = local_d8;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = local_148.m_x;
    auVar17._4_4_ = local_148.m_y;
    local_148.m_w = dVar7.m_w;
    auVar33 = vinsertps_avx(ZEXT416((uint)(local_148.m_z - local_168.m_z)),
                            ZEXT416((uint)local_148.m_w),0x10);
    auVar13 = vsubps_avx(auVar17,auVar28);
    local_c8 = (dgTemplateVector<float>)vmovlhps_avx(auVar13,auVar33);
    auVar18._8_8_ = 0;
    auVar18._0_4_ = local_d8.m_x;
    auVar18._4_4_ = local_d8.m_y;
    auVar13 = vsubps_avx(auVar18,auVar28);
    local_158.m_z = dVar49.m_z;
    local_158.m_w = dVar49.m_w;
    auVar33 = vinsertps_avx(ZEXT416((uint)(local_158.m_z - local_168.m_z)),
                            ZEXT416((uint)local_158.m_w),0x10);
    auVar39 = ZEXT856(auVar33._8_8_);
    local_68 = (dgTemplateVector<float>)vmovlhps_avx(auVar13,auVar33);
    auVar27 = ZEXT856(local_68._8_8_);
    local_158 = dVar49;
    local_148 = dVar7;
    local_d8 = dVar49;
    dVar49 = dgTemplateVector<float>::operator*(&local_c8,&local_68);
    auVar38._0_8_ = dVar49._8_8_;
    auVar38._8_56_ = auVar39;
    auVar26._0_8_ = dVar49._0_8_;
    auVar26._8_56_ = auVar27;
    local_178 = (dgTemplateVector<float>)vmovlhps_avx(auVar26._0_16_,auVar38._0_16_);
    dgVector::dgVector((dgVector *)&local_d8,&local_178);
    auVar33 = vfmadd231ss_fma(ZEXT416((uint)(local_d8.m_y * local_d8.m_y)),
                              ZEXT416((uint)local_d8.m_x),ZEXT416((uint)local_d8.m_x));
    auVar33 = vfmadd213ss_fma(ZEXT416((uint)local_d8.m_z),ZEXT416((uint)local_d8.m_z),auVar33);
    auVar33 = vsqrtss_avx(auVar33,auVar33);
    fVar40 = auVar33._0_4_ * 0.5;
    auVar29._0_4_ = local_168.m_x + local_148.m_x + local_158.m_x;
    auVar29._4_4_ = local_168.m_y + local_148.m_y + local_158.m_y;
    auVar29._8_8_ = 0;
    local_b8._0_4_ = fVar40;
    local_138 = (undefined1  [8])(double)fVar40;
    auVar33 = vinsertps_avx(ZEXT416((uint)(local_168.m_z + local_148.m_z + local_158.m_z)),
                            ZEXT416((uint)local_168.m_w),0x10);
    local_c8 = (dgTemplateVector<float>)vmovlhps_avx(auVar29,auVar33);
    dgVector::dgVector((dgVector *)&local_178,&local_c8);
    dVar49 = local_178;
    auVar30._8_8_ = 0;
    auVar30._0_4_ = local_178.m_x;
    auVar30._4_4_ = local_178.m_y;
    local_178.m_z = dVar49.m_z;
    auVar15._8_4_ = 0x3eaaaaab;
    auVar15._0_8_ = 0x3eaaaaab3eaaaaab;
    auVar15._12_4_ = 0x3eaaaaab;
    auVar13 = vmulps_avx512vl(auVar30,auVar15);
    local_178.m_w = dVar49.m_w;
    auVar33 = vinsertps_avx(ZEXT416((uint)(local_178.m_z * 0.33333334)),ZEXT416((uint)local_178.m_w)
                            ,0x10);
    local_c8 = (dgTemplateVector<float>)vmovlhps_avx(auVar13,auVar33);
    local_178 = dVar49;
    dgVector::dgVector((dgVector *)&local_178,&local_c8);
    dVar8 = local_148;
    dVar7 = local_158;
    dVar49 = local_178;
    auVar31._8_8_ = 0;
    auVar31._0_4_ = local_148.m_y;
    auVar31._4_4_ = local_148.m_z;
    auVar45._4_4_ = local_168.m_z;
    auVar45._0_4_ = local_168.m_y;
    auVar45._8_8_ = 0;
    local_148.m_x = dVar8.m_x;
    auVar48._8_8_ = 0x400000000;
    auVar48._0_8_ = 0x400000000;
    auVar43._8_8_ = 0;
    auVar43._0_4_ = local_178.m_y;
    auVar43._4_4_ = local_178.m_z;
    local_178.m_x = dVar49.m_x;
    auVar33 = vshufps_avx(auVar31,auVar31,0x41);
    auVar21 = vshufps_avx(auVar45,auVar45,0x41);
    auVar13 = vmovshdup_avx(auVar43);
    auVar14 = vpermt2ps_avx512vl(ZEXT416((uint)local_148.m_x),auVar48,auVar33);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(dVar8.m_y * dVar8.m_y)),auVar45,auVar45);
    auVar46._8_8_ = 0;
    auVar46._0_4_ = local_158.m_y;
    auVar46._4_4_ = local_158.m_z;
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_x * local_148.m_x)),
                              ZEXT416((uint)local_168.m_x),ZEXT416((uint)local_168.m_x));
    auVar15 = vpermt2ps_avx512vl(ZEXT416((uint)local_168.m_x),auVar48,auVar21);
    auVar44._0_4_ = auVar14._0_4_ * auVar33._0_4_;
    auVar44._4_4_ = auVar14._4_4_ * auVar33._4_4_;
    auVar44._8_4_ = auVar14._8_4_ * auVar33._8_4_;
    auVar44._12_4_ = auVar14._12_4_ * auVar33._12_4_;
    auVar21 = vfmadd213ps_fma(auVar15,auVar21,auVar44);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)local_158.m_x),ZEXT416((uint)local_158.m_x));
    auVar33 = vshufps_avx(auVar46,auVar46,0x41);
    auVar14 = vfmadd231ss_fma(auVar16,auVar46,auVar46);
    auVar16 = vpermt2ps_avx512vl(ZEXT416((uint)local_158.m_x),auVar48,auVar33);
    auVar33 = vfmadd213ps_fma(auVar16,auVar33,auVar21);
    fVar40 = auVar13._0_4_;
    local_158 = dVar7;
    local_148 = dVar8;
    fVar42 = dVar49.m_y;
    if (0.0001 < (float)local_b8._0_4_) {
      auVar32._0_8_ = (double)auVar14._0_4_;
      auVar32._8_8_ = auVar14._8_8_;
      auVar19._0_8_ = (double)auVar20._0_4_;
      auVar19._8_8_ = auVar20._8_8_;
      auVar21 = vcvtps2pd_avx(auVar43);
      auVar2 = vcvtps2pd_avx(auVar33);
      local_178.m_w = dVar49.m_w;
      dStack_40 = (double)local_138 / 12.0;
      auVar47._0_8_ = (double)local_178.m_x;
      auVar47._8_8_ = 0;
      auVar4 = vpermpd_avx2(ZEXT1632(auVar21),0x45);
      auVar33 = vmovlhps_avx(auVar47,auVar21);
      auVar5._12_4_ = 0x40220000;
      auVar5._0_12_ = ZEXT812(0x4022000000000000);
      auVar16 = vmulpd_avx512vl(auVar33,auVar5);
      auVar33 = vfmadd231sd_fma(auVar19,auVar16,auVar47);
      local_90 = dStack_40 * auVar33._0_8_;
      auVar33 = vshufpd_avx(auVar16,auVar16,1);
      auVar33 = vfmadd213sd_fma(auVar33,auVar21,auVar32);
      local_98 = dStack_40 * auVar33._0_8_;
      auVar33 = vshufpd_avx(auVar21,auVar21,1);
      dVar3 = auVar33._0_8_ * 9.0;
      auVar22._8_8_ = dVar3;
      auVar22._0_8_ = dVar3;
      auVar22._16_8_ = dVar3;
      auVar22._24_8_ = dVar3;
      auVar1 = vblendpd_avx(ZEXT1632(auVar16),auVar22,8);
      auVar1 = vpermpd_avx2(auVar1,0xc4);
      auVar33 = vfmadd213pd_fma(auVar1,auVar4,auVar2);
      local_58 = dStack_40 * auVar33._0_8_;
      dStack_50 = dStack_40 * auVar33._8_8_;
      dStack_48 = dStack_40 * 0.0;
      dStack_40 = dStack_40 * 0.0;
      auVar33 = vinsertps_avx(ZEXT416((uint)((float)local_b8._0_4_ * local_178.m_x)),
                              ZEXT416((uint)((float)local_b8._0_4_ * dVar49.m_y)),0x10);
      auVar13 = vinsertps_avx(ZEXT416((uint)((float)local_b8._0_4_ * auVar13._0_4_)),
                              ZEXT416((uint)local_178.m_w),0x10);
      local_c8 = (dgTemplateVector<float>)vmovlhps_avx(auVar33,auVar13);
      local_178 = dVar49;
      dgVector::dgVector((dgVector *)&local_178,&local_c8);
      auVar20._0_4_ = (float)local_90;
      auVar20._4_12_ = in_register_00001584;
      auVar1._8_8_ = dStack_50;
      auVar1._0_8_ = local_58;
      auVar1._16_8_ = dStack_48;
      auVar1._24_8_ = dStack_40;
      auVar33 = vcvtpd2ps_avx(auVar1);
      auVar14._0_4_ = (float)local_98;
      auVar14._4_12_ = in_register_00001584;
      fVar40 = local_178.m_z;
      dVar49 = local_178;
      fVar42 = local_178.m_y;
    }
    local_178 = dVar49;
    local_118 = local_118 + (double)local_138;
    local_180 = local_180 + fVar42;
    local_184 = local_184 + local_178.m_x;
    local_17c = local_17c + fVar40;
    auVar13 = vshufps_avx(auVar33,auVar33,0xff);
    local_b8 = auVar33;
    dgVector::dgVector((dgVector *)&local_178,auVar20._0_4_,auVar14._0_4_,auVar13._0_4_,0.0);
    fVar40 = auVar41._0_4_ + local_178.m_z;
    local_108._4_4_ = (float)local_108._4_4_ + local_178.m_y;
    local_108._0_4_ = (float)local_108._0_4_ + local_178.m_x;
    fStack_100 = fStack_100 + 0.0;
    fStack_fc = fStack_fc + 0.0;
    auVar33 = vmovshdup_avx(local_b8);
    auVar13 = vshufpd_avx(local_b8,local_b8,1);
    dgVector::dgVector((dgVector *)&local_178,auVar13._0_4_,local_b8._0_4_,auVar33._0_4_,0.0);
    dVar49 = local_178;
    auVar13._8_8_ = 0;
    auVar13._0_4_ = local_178.m_x;
    auVar13._4_4_ = local_178.m_y;
    auVar41 = ZEXT464((uint)fVar40);
    local_128._0_8_ = local_128._0_8_ + 3;
    local_178.m_z = dVar49.m_z;
    auVar34 = ZEXT464((uint)(auVar34._0_4_ + local_178.m_z));
    local_f8._0_4_ = (float)local_f8._0_4_ + dVar49.m_x;
    local_f8._4_4_ = (float)local_f8._4_4_ + dVar49.m_y;
    fStack_f0 = fStack_f0 + 0.0;
    fStack_ec = fStack_ec + 0.0;
    local_178 = dVar49;
  }
  if (local_118 <= 9.999999747378752e-05) {
    local_128 = vmovshdup_avx(_local_108);
    _local_138 = vmovshdup_avx(_local_f8);
  }
  else {
    local_138._4_4_ = (undefined4)(1.0 / local_118);
    local_118 = (double)CONCAT44((int)((ulong)(1.0 / local_118) >> 0x20),local_138._4_4_);
    uStack_110 = 0;
    local_138._0_4_ = local_138._4_4_;
    fStack_130 = (float)local_138._4_4_;
    fStack_12c = (float)local_138._4_4_;
    auVar21._0_4_ = (float)local_138._4_4_ * (float)local_108._0_4_;
    auVar21._4_4_ = (float)local_138._4_4_ * (float)local_108._4_4_;
    auVar21._8_4_ = (float)local_138._4_4_ * fStack_100;
    auVar21._12_4_ = (float)local_138._4_4_ * fStack_fc;
    local_148 = (dgTemplateVector<float>)
                vinsertps_avx(auVar21,ZEXT416((uint)(auVar41._0_4_ * (float)local_138._4_4_)),0x28);
    dgVector::dgVector((dgVector *)&local_168,&local_148);
    fVar40 = local_168.m_z;
    _local_108 = ZEXT416((uint)local_168.m_x);
    local_128 = ZEXT416((uint)local_168.m_y);
    auVar16._0_4_ = (float)local_f8._0_4_ * (float)local_138._0_4_;
    auVar16._4_4_ = (float)local_f8._4_4_ * (float)local_138._4_4_;
    auVar16._8_4_ = fStack_f0 * fStack_130;
    auVar16._12_4_ = fStack_ec * fStack_12c;
    local_148 = (dgTemplateVector<float>)
                vinsertps_avx(auVar16,ZEXT416((uint)(auVar34._0_4_ * local_118._0_4_)),0x28);
    dgVector::dgVector((dgVector *)&local_168,&local_148);
    fVar42 = local_168.m_z;
    _local_f8 = ZEXT416((uint)local_168.m_x);
    _local_138 = ZEXT416((uint)local_168.m_y);
    auVar33 = vinsertps_avx(ZEXT416((uint)(local_118._0_4_ * local_184)),
                            ZEXT416((uint)(local_118._0_4_ * local_180)),0x10);
    local_148 = (dgTemplateVector<float>)
                vinsertps_avx(auVar33,ZEXT416((uint)(local_118._0_4_ * local_17c)),0x28);
    dgVector::dgVector((dgVector *)&local_168,&local_148);
    auVar13 = ZEXT416((uint)fVar40);
    auVar33 = ZEXT416((uint)fVar42);
    local_17c = local_168.m_z;
    local_180 = local_168.m_y;
    local_184 = local_168.m_x;
  }
  _local_f8 = vfnmadd231ss_fma(_local_f8,ZEXT416((uint)local_184),ZEXT416((uint)local_180));
  auVar33 = vfnmadd231ss_fma(auVar33,ZEXT416((uint)local_180),ZEXT416((uint)local_17c));
  auVar13 = vfnmadd231ss_fma(auVar13,ZEXT416((uint)local_17c),ZEXT416((uint)local_17c));
  auVar21 = vfnmadd231ss_fma(_local_108,ZEXT416((uint)local_184),ZEXT416((uint)local_184));
  local_128 = vfnmadd231ss_fma(local_128,ZEXT416((uint)local_180),ZEXT416((uint)local_180));
  _local_138 = vfnmadd231ss_fma(_local_138,ZEXT416((uint)local_17c),ZEXT416((uint)local_184));
  dgVector::dgVector((dgVector *)&local_168,auVar21._0_4_,local_f8._0_4_,local_138._0_4_,0.0);
  pdVar6 = local_a8;
  (pdVar6->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x = local_168.m_x;
  (pdVar6->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = local_168.m_y;
  (pdVar6->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = local_168.m_z;
  (pdVar6->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = local_168.m_w;
  dgVector::dgVector((dgVector *)&local_168,(HaF32)local_f8._0_4_,(HaF32)local_128._0_4_,
                     auVar33._0_4_,0.0);
  (pdVar6->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x = local_168.m_x;
  (pdVar6->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = local_168.m_y;
  (pdVar6->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = local_168.m_z;
  (pdVar6->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = local_168.m_w;
  dgVector::dgVector((dgVector *)&local_168,(HaF32)local_138._0_4_,auVar33._0_4_,auVar13._0_4_,0.0);
  (pdVar6->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x = local_168.m_x;
  (pdVar6->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = local_168.m_y;
  (pdVar6->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = local_168.m_z;
  (pdVar6->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = local_168.m_w;
  initialGuess = dgGetIdentityMatrix();
  dgMatrix::EigenVectors(&pdVar6->super_dgMatrix,local_a0,initialGuess);
  return;
}

Assistant:

static void Statistics (dgSphere &sphere, dgVector &eigenValues, dgVector &scaleVector, const hacd::HaF32 vertex[], const hacd::HaI32 faceIndex[], hacd::HaI32 indexCount, hacd::HaI32 stride)
	{
		dgVector var (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector cov (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector centre (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgVector massCenter (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));

		hacd::HaF64 totalArea = hacd::HaF32 (0.0f);
		const hacd::HaF32* const ptr = vertex;
		for (hacd::HaI32 i = 0; i < indexCount; i += 3) {
			hacd::HaI32 index = faceIndex[i] * stride;
			dgVector p0 (&ptr[index]);
			p0 = p0.CompProduct (scaleVector);

			index = faceIndex[i + 1] * stride;;
			dgVector p1 (&ptr[index]);
			p1 = p1.CompProduct (scaleVector);

			index = faceIndex[i + 2] * stride;;
			dgVector p2 (&ptr[index]);
			p2 = p2.CompProduct (scaleVector);

			dgVector normal ((p1 - p0) * (p2 - p0));

			hacd::HaF64 area = hacd::HaF32 (0.5f) * sqrt (normal % normal);

			centre = p0 + p1 + p2;
			centre = centre.Scale (hacd::HaF32  (1.0f / 3.0f));

			// Inertia of each point in the triangle
			hacd::HaF64 Ixx = p0.m_x * p0.m_x + p1.m_x * p1.m_x + p2.m_x * p2.m_x;	
			hacd::HaF64 Iyy = p0.m_y * p0.m_y + p1.m_y * p1.m_y + p2.m_y * p2.m_y;	
			hacd::HaF64 Izz = p0.m_z * p0.m_z + p1.m_z * p1.m_z + p2.m_z * p2.m_z;	

			hacd::HaF64 Ixy = p0.m_x * p0.m_y + p1.m_x * p1.m_y + p2.m_x * p2.m_y;	
			hacd::HaF64 Iyz = p0.m_y * p0.m_z + p1.m_y * p1.m_z + p2.m_y * p2.m_z;	
			hacd::HaF64 Ixz = p0.m_x * p0.m_z + p1.m_x * p1.m_z + p2.m_x * p2.m_z;	

			if (area > dgEPSILON * 10.0) {
				hacd::HaF64 K = area / hacd::HaF64 (12.0);
				//Coriolis theorem for Inertia of a triangle in an arbitrary orientation
				Ixx = K * (Ixx + 9.0 * centre.m_x * centre.m_x);
				Iyy = K * (Iyy + 9.0 * centre.m_y * centre.m_y);
				Izz = K * (Izz + 9.0 * centre.m_z * centre.m_z);

				Ixy = K * (Ixy + 9.0 * centre.m_x * centre.m_y);
				Ixz = K * (Ixz + 9.0 * centre.m_x * centre.m_z);
				Iyz = K * (Iyz + 9.0 * centre.m_y * centre.m_z);
				centre = centre.Scale ((hacd::HaF32)area);
			} 

			totalArea += area;
			massCenter += centre;
			var += dgVector ((hacd::HaF32)Ixx, (hacd::HaF32)Iyy, (hacd::HaF32)Izz, hacd::HaF32 (0.0f));
			cov += dgVector ((hacd::HaF32)Ixy, (hacd::HaF32)Ixz, (hacd::HaF32)Iyz, hacd::HaF32 (0.0f));
		}

		if (totalArea > dgEPSILON * 10.0) {
			hacd::HaF64 K = hacd::HaF64 (1.0) / totalArea; 
			var = var.Scale ((hacd::HaF32)K);
			cov = cov.Scale ((hacd::HaF32)K);
			massCenter = massCenter.Scale ((hacd::HaF32)K);
		}

		hacd::HaF64 Ixx = var.m_x - massCenter.m_x * massCenter.m_x;
		hacd::HaF64 Iyy = var.m_y - massCenter.m_y * massCenter.m_y;
		hacd::HaF64 Izz = var.m_z - massCenter.m_z * massCenter.m_z;

		hacd::HaF64 Ixy = cov.m_x - massCenter.m_x * massCenter.m_y;
		hacd::HaF64 Ixz = cov.m_y - massCenter.m_x * massCenter.m_z;
		hacd::HaF64 Iyz = cov.m_z - massCenter.m_y * massCenter.m_z;

		sphere.m_front = dgVector ((hacd::HaF32)Ixx, (hacd::HaF32)Ixy, (hacd::HaF32)Ixz, hacd::HaF32 (0.0f));
		sphere.m_up    = dgVector ((hacd::HaF32)Ixy, (hacd::HaF32)Iyy, (hacd::HaF32)Iyz, hacd::HaF32 (0.0f));
		sphere.m_right = dgVector ((hacd::HaF32)Ixz, (hacd::HaF32)Iyz, (hacd::HaF32)Izz, hacd::HaF32 (0.0f));
		sphere.EigenVectors(eigenValues);
	}